

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O2

void MakeCrcTable(void)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  
  for (uVar3 = 0; uVar3 != 0x100; uVar3 = uVar3 + 1) {
    iVar4 = 8;
    uVar5 = uVar3 & 0xffffffff;
    while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
      uVar1 = uVar5 >> 1;
      uVar2 = uVar5 & 1;
      uVar5 = (ulong)((uint)uVar1 ^ 0xa001);
      if (uVar2 == 0) {
        uVar5 = uVar1;
      }
    }
    mCrcTable[uVar3] = (UINT16)uVar5;
  }
  return;
}

Assistant:

STATIC
  VOID
  MakeCrcTable (
  VOID
  )
{
  UINT32  Index;
  UINT32  Index2;
  UINT32  Temp;

  for (Index = 0; Index <= UINT8_MAX; Index++) {
    Temp = Index;
    for (Index2 = 0; Index2 < UINT8_BIT; Index2++) {
      if (Temp & 1) {
        Temp = (Temp >> 1) ^ CRCPOLY;
      } else {
        Temp >>= 1;
      }
    }

    mCrcTable[Index] = (UINT16) Temp;
  }
}